

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O1

ly_bool lyd_node_should_print(lyd_node *node,uint32_t options)

{
  ushort uVar1;
  uint uVar2;
  lysc_node *plVar3;
  ly_bool lVar4;
  lyd_node *plVar5;
  lyd_node_inner *plVar6;
  lyd_node_inner *plVar7;
  lyd_node *plVar8;
  
  uVar2 = node->flags;
  if ((options & 0x10) == 0) {
    if (((uVar2 & 1) == 0) || (node->schema->nodetype != 1)) {
      if (((options & 0xe0) == 0 && (uVar2 & 1) != 0) &&
         (uVar1 = node->schema->flags, (uVar1 & 2) == 0)) {
        plVar6 = (lyd_node_inner *)node;
        if (node == (lyd_node *)0x0 || (uVar1 & 0x7001) != 1) {
          return '\0';
        }
        while( true ) {
          plVar3 = (plVar6->field_0).node.schema;
          if (((plVar3->nodetype != 1) || ((plVar3->flags & 0x80) != 0)) &&
             ((plVar3->flags & 2) != 0)) break;
          if ((plVar3->nodetype & 0x711) == 0) {
            plVar7 = (lyd_node_inner *)0x0;
          }
          else {
            plVar7 = (lyd_node_inner *)plVar6->child;
          }
          if (plVar7 == (lyd_node_inner *)0x0) {
            if (plVar6 == (lyd_node_inner *)node) {
              return '\0';
            }
            plVar7 = (lyd_node_inner *)(plVar6->field_0).node.next;
          }
          if (plVar7 == (lyd_node_inner *)0x0) {
            do {
              plVar6 = *(lyd_node_inner **)((long)&plVar6->field_0 + 0x10);
              if ((plVar6->field_0).node.parent == node->parent) break;
              plVar7 = (lyd_node_inner *)(plVar6->field_0).node.next;
            } while (plVar7 == (lyd_node_inner *)0x0);
          }
          plVar6 = plVar7;
          if (plVar7 == (lyd_node_inner *)0x0) {
            return '\0';
          }
        }
      }
    }
    else if ((options & 4) == 0) {
      plVar8 = node;
      if (node == (lyd_node *)0x0) {
        return '\0';
      }
      while ((plVar8 == node || (lVar4 = lyd_node_should_print(plVar8,options), lVar4 == '\0'))) {
        if ((plVar8->flags & 1) == 0) {
          __assert_fail("elem->flags & LYD_DEFAULT",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c"
                        ,0x54,"ly_bool lyd_node_should_print(const struct lyd_node *, uint32_t)");
        }
        if ((plVar8->schema == (lysc_node *)0x0) || ((plVar8->schema->nodetype & 0x711) != 0)) {
          plVar5 = *(lyd_node **)(plVar8 + 1);
        }
        else {
          plVar5 = (lyd_node *)0x0;
        }
        if (plVar5 == (lyd_node *)0x0) {
          if (plVar8 == node) {
            return '\0';
          }
          plVar5 = plVar8->next;
        }
        if (plVar5 == (lyd_node *)0x0) {
          for (plVar6 = plVar8->parent;
              ((plVar6->field_0).node.parent != node->parent &&
              (plVar5 = (plVar6->field_0).node.next, plVar5 == (lyd_node *)0x0));
              plVar6 = (plVar6->field_0).node.parent) {
          }
        }
        plVar8 = plVar5;
        if (plVar5 == (lyd_node *)0x0) {
          return '\0';
        }
      }
    }
  }
  else {
    if ((uVar2 & 1) != 0) {
      return '\0';
    }
    plVar3 = node->schema;
    if (plVar3 != (lysc_node *)0x0) {
      if ((plVar3->nodetype & 0xc) == 0) {
        if ((((plVar3 != (lysc_node *)0x0) && (plVar3->nodetype == 1)) &&
            ((plVar3->flags & 0x80) == 0)) && ((options & 4) == 0)) {
          if (node == (lyd_node *)0x0) {
            plVar8 = (lyd_node *)0x0;
          }
          else {
            plVar8 = *(lyd_node **)(node + 1);
          }
          if (plVar8 == (lyd_node *)0x0) {
            return '\0';
          }
          while (lVar4 = lyd_node_should_print(plVar8,options), lVar4 == '\0') {
            plVar8 = plVar8->next;
            if (plVar8 == (lyd_node *)0x0) {
              return '\0';
            }
          }
        }
      }
      else {
        lVar4 = lyd_is_default(node);
        if (lVar4 != '\0') {
          return '\0';
        }
      }
    }
  }
  return '\x01';
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_node_should_print(const struct lyd_node *node, uint32_t options)
{
    const struct lyd_node *elem;

    if (options & LYD_PRINT_WD_TRIM) {
        /* do not print default nodes */
        if (node->flags & LYD_DEFAULT) {
            /* implicit default node/NP container with only default nodes */
            return 0;
        } else if (node->schema && (node->schema->nodetype & LYD_NODE_TERM)) {
            if (lyd_is_default(node)) {
                /* explicit default node */
                return 0;
            }
        } else if (lysc_is_np_cont(node->schema)) {
            if (options & LYD_PRINT_KEEPEMPTYCONT) {
                /* explicit request to print, redundant to check */
                return 1;
            }

            LY_LIST_FOR(lyd_child(node), elem) {
                if (lyd_node_should_print(elem, options)) {
                    return 1;
                }
            }

            /* NP container without any printed children (such as other NP containers with only nodes set to their default values) */
            return 0;
        }
    } else if ((node->flags & LYD_DEFAULT) && (node->schema->nodetype == LYS_CONTAINER)) {
        if (options & LYD_PRINT_KEEPEMPTYCONT) {
            /* explicit request to print */
            return 1;
        }

        /* avoid empty default containers */
        LYD_TREE_DFS_BEGIN(node, elem) {
            if ((elem != node) && lyd_node_should_print(elem, options)) {
                return 1;
            }
            assert(elem->flags & LYD_DEFAULT);
            LYD_TREE_DFS_END(node, elem)
        }
        return 0;
    } else if ((node->flags & LYD_DEFAULT) && !(options & LYD_PRINT_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYD_PRINT_WD_EXPLICIT, find out if this is some input/output */
        if (!(node->schema->flags & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) && (node->schema->flags & LYS_CONFIG_W)) {
            /* print only if it contains status data in its subtree */
            LYD_TREE_DFS_BEGIN(node, elem) {
                if ((elem->schema->nodetype != LYS_CONTAINER) || (elem->schema->flags & LYS_PRESENCE)) {
                    if (elem->schema->flags & LYS_CONFIG_R) {
                        return 1;
                    }
                }
                LYD_TREE_DFS_END(node, elem)
            }
        }
        return 0;
    }

    return 1;
}